

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::ArrowToDuckDBList
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               int64_t parent_offset)

{
  uint *puVar1;
  ArrowScanLocalState *scan_state;
  void *pvVar2;
  void *pvVar3;
  ArrowArray *pAVar4;
  ArrowVariableSizeType AVar5;
  bool bVar6;
  ArrowArrayPhysicalType AVar7;
  list_entry_t *le;
  ArrowListInfo *this;
  ArrowListInfo *this_00;
  ulong *puVar8;
  ulong *puVar9;
  Vector *vector_00;
  long lVar10;
  ArrowArrayScanState *array_state_00;
  ArrowType *type;
  int64_t iVar11;
  long *plVar12;
  ulong *puVar13;
  uint uVar14;
  ulong uVar15;
  idx_t i;
  ulong uVar16;
  idx_t iVar17;
  uint uVar18;
  ulong uVar19;
  idx_t iVar20;
  uint64_t in_stack_ffffffffffffff90;
  
  scan_state = array_state->state;
  this = ArrowType::GetTypeInfo<duckdb::ArrowListInfo>(arrow_type);
  SetValidityMask(vector,array,scan_state,size,parent_offset,nested_offset,false);
  lVar10 = array->offset + parent_offset + scan_state->chunk_offset;
  if (nested_offset != -1) {
    lVar10 = nested_offset + array->offset;
  }
  this_00 = ArrowType::GetTypeInfo<duckdb::ArrowListInfo>(arrow_type);
  AVar5 = ArrowListInfo::GetSizeType(this_00);
  bVar6 = ArrowListInfo::IsView(this_00);
  if (bVar6) {
    pvVar2 = array->buffers[1];
    pvVar3 = array->buffers[2];
    if (AVar5 == NORMAL) {
      puVar1 = (uint *)((long)pvVar2 + lVar10 * 4);
      if (size == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = *puVar1;
      }
      puVar9 = (ulong *)vector->data;
      puVar13 = puVar9 + 1;
      iVar20 = 0;
      for (iVar17 = 0; size != iVar17; iVar17 = iVar17 + 1) {
        uVar18 = puVar1[iVar17];
        puVar13[-1] = (ulong)uVar18;
        uVar19 = (ulong)*(uint *)((long)pvVar3 + iVar17 * 4 + lVar10 * 4);
        iVar20 = iVar20 + uVar19;
        if (uVar14 < uVar18) {
          uVar18 = uVar14;
        }
        if (uVar19 == 0) {
          uVar18 = uVar14;
        }
        uVar14 = uVar18;
        *puVar13 = uVar19;
        puVar13 = puVar13 + 2;
      }
      if (uVar14 != 0) {
        uVar19 = (ulong)uVar14;
        iVar17 = size;
        while (bVar6 = iVar17 != 0, iVar17 = iVar17 - 1, bVar6) {
          uVar16 = *puVar9 - uVar19;
          if (*puVar9 < uVar19) {
            uVar16 = 0;
          }
          *puVar9 = uVar16;
          puVar9 = puVar9 + 2;
        }
        goto LAB_0089086b;
      }
    }
    else {
      puVar13 = (ulong *)((long)pvVar2 + lVar10 * 8);
      if (size == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = *puVar13;
      }
      puVar8 = (ulong *)vector->data;
      puVar9 = puVar8 + 1;
      iVar20 = 0;
      for (iVar17 = 0; size != iVar17; iVar17 = iVar17 + 1) {
        puVar9[-1] = puVar13[iVar17];
        uVar16 = *(ulong *)((long)pvVar3 + iVar17 * 8 + lVar10 * 8);
        *puVar9 = uVar16;
        if ((uVar16 != 0) && (puVar13[iVar17] <= uVar19)) {
          uVar19 = puVar13[iVar17];
        }
        iVar20 = iVar20 + uVar16;
        puVar9 = puVar9 + 2;
      }
      if (uVar19 != 0) {
        iVar17 = size;
        while (bVar6 = iVar17 != 0, iVar17 = iVar17 - 1, bVar6) {
          uVar16 = *puVar8 - uVar19;
          if (*puVar8 < uVar19) {
            uVar16 = 0;
          }
          *puVar8 = uVar16;
          puVar8 = puVar8 + 2;
        }
        goto LAB_0089086b;
      }
    }
    uVar19 = 0;
    goto LAB_0089086b;
  }
  if (AVar5 == NORMAL) {
    if (size != 0) {
      puVar1 = (uint *)((long)array->buffers[1] + lVar10 * 4);
      uVar19 = (ulong)*puVar1;
      puVar13 = (ulong *)(vector->data + 8);
      uVar15 = 0;
      uVar16 = uVar19;
      for (iVar20 = 0; size != iVar20; iVar20 = iVar20 + 1) {
        puVar13[-1] = uVar15;
        uVar14 = puVar1[iVar20 + 1];
        uVar16 = (ulong)(uVar14 - (int)uVar16);
        *puVar13 = uVar16;
        uVar15 = uVar15 + uVar16;
        puVar13 = puVar13 + 2;
        uVar16 = (ulong)uVar14;
      }
      uVar16 = (ulong)puVar1[size];
      goto LAB_008907ef;
    }
  }
  else if (size != 0) {
    puVar13 = (ulong *)((long)array->buffers[1] + lVar10 * 8);
    uVar19 = *puVar13;
    plVar12 = (long *)(vector->data + 8);
    lVar10 = 0;
    for (iVar20 = 0; size != iVar20; iVar20 = iVar20 + 1) {
      plVar12[-1] = lVar10;
      uVar16 = puVar13[iVar20 + 1];
      uVar15 = puVar13[iVar20];
      *plVar12 = uVar16 - uVar15;
      lVar10 = lVar10 + (uVar16 - uVar15);
      plVar12 = plVar12 + 2;
    }
    uVar16 = puVar13[size];
LAB_008907ef:
    iVar20 = uVar16 - uVar19;
    goto LAB_0089086b;
  }
  iVar20 = 0;
  uVar19 = 0;
LAB_0089086b:
  ListVector::Reserve(vector,iVar20);
  ListVector::SetListSize(vector,iVar20);
  vector_00 = ListVector::GetEntry(vector);
  iVar11 = array->offset;
  pAVar4 = *array->children;
  lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar19);
  SetValidityMask(vector_00,pAVar4,scan_state,iVar20,iVar11,lVar10,false);
  FlatVector::VerifyFlatVector(vector);
  if ((parent_mask != (ValidityMask *)0x0) &&
     ((parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
      (unsigned_long *)0x0)) {
    for (iVar17 = 0; size != iVar17; iVar17 = iVar17 + 1) {
      bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&parent_mask->super_TemplatedValidityMask<unsigned_long>,iVar17);
      if (!bVar6) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar17);
      }
    }
  }
  array_state_00 = ArrowArrayScanState::GetChild(array_state,0);
  pAVar4 = *array->children;
  type = ArrowListInfo::GetChild(this);
  if (iVar20 == 0 && uVar19 == 0) {
    iVar11 = -1;
    iVar20 = 0;
  }
  else {
    AVar7 = anon_unknown_2::GetArrowArrayPhysicalType(type);
    iVar11 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar19);
    if (AVar7 != DEFAULT) {
      if (AVar7 == RUN_END_ENCODED) {
        ColumnArrowToDuckDBRunEndEncoded
                  (vector_00,pAVar4,array_state_00,iVar20,type,iVar11,(ValidityMask *)0x0,
                   in_stack_ffffffffffffff90);
        return;
      }
      ColumnArrowToDuckDBDictionary
                (vector_00,pAVar4,array_state_00,iVar20,type,iVar11,(ValidityMask *)0x0,0);
      return;
    }
  }
  ColumnArrowToDuckDB(vector_00,pAVar4,array_state_00,iVar20,type,iVar11,(ValidityMask *)0x0,0,false
                     );
  return;
}

Assistant:

static void ArrowToDuckDBList(Vector &vector, ArrowArray &array, ArrowArrayScanState &array_state, idx_t size,
                              const ArrowType &arrow_type, int64_t nested_offset, const ValidityMask *parent_mask,
                              int64_t parent_offset) {
	auto &scan_state = array_state.state;

	auto &list_info = arrow_type.GetTypeInfo<ArrowListInfo>();
	SetValidityMask(vector, array, scan_state, size, parent_offset, nested_offset);

	auto effective_offset = GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
	auto list_data = ConvertArrowListOffsets(vector, array, size, arrow_type, effective_offset);
	auto &start_offset = list_data.start_offset;
	auto &list_size = list_data.list_size;

	ListVector::Reserve(vector, list_size);
	ListVector::SetListSize(vector, list_size);
	auto &child_vector = ListVector::GetEntry(vector);
	SetValidityMask(child_vector, *array.children[0], scan_state, list_size, array.offset,
	                NumericCast<int64_t>(start_offset));
	auto &list_mask = FlatVector::Validity(vector);
	if (parent_mask) {
		//! Since this List is owned by a struct we must guarantee their validity map matches on Null
		if (!parent_mask->AllValid()) {
			for (idx_t i = 0; i < size; i++) {
				if (!parent_mask->RowIsValid(i)) {
					list_mask.SetInvalid(i);
				}
			}
		}
	}
	auto &child_state = array_state.GetChild(0);
	auto &child_array = *array.children[0];
	auto &child_type = list_info.GetChild();

	if (list_size == 0 && start_offset == 0) {
		D_ASSERT(!child_array.dictionary);
		ColumnArrowToDuckDB(child_vector, child_array, child_state, list_size, child_type, -1);
		return;
	}

	auto array_physical_type = GetArrowArrayPhysicalType(child_type);
	switch (array_physical_type) {
	case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
		// TODO: add support for offsets
		ColumnArrowToDuckDBDictionary(child_vector, child_array, child_state, list_size, child_type,
		                              NumericCast<int64_t>(start_offset));
		break;
	case ArrowArrayPhysicalType::RUN_END_ENCODED:
		ColumnArrowToDuckDBRunEndEncoded(child_vector, child_array, child_state, list_size, child_type,
		                                 NumericCast<int64_t>(start_offset));
		break;
	case ArrowArrayPhysicalType::DEFAULT:
		ColumnArrowToDuckDB(child_vector, child_array, child_state, list_size, child_type,
		                    NumericCast<int64_t>(start_offset));
		break;
	default:
		throw NotImplementedException("ArrowArrayPhysicalType not recognized");
	}
}